

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type_examples.cpp
# Opt level: O0

void density_tests::runtime_type_examples(void)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  void *i_dest;
  f_ostream *this;
  runtime_type<> local_78;
  runtime_type<> r_2;
  runtime_type<> r2;
  runtime_type<> r1;
  Rt1 t2_1;
  Rt1 t1_1;
  Rt1 t2;
  Rt1 t1;
  runtime_type<> r_1;
  R r;
  void *buff;
  runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
  type;
  RuntimeType_3 c;
  RuntimeType_2 b;
  RuntimeType_1 a;
  
  density::runtime_type<density::f_size,_density::f_alignment>::runtime_type
            ((runtime_type<density::f_size,_density::f_alignment> *)&b);
  density::runtime_type<density::f_size,density::f_none,density::f_size,density::f_alignment>::
  runtime_type<density::f_size,density::f_alignment>
            ((runtime_type<density::f_size,density::f_none,density::f_size,density::f_alignment> *)
             &c,(runtime_type<density::f_size,_density::f_alignment> *)&b,0);
  density::
  runtime_type<density::feature_list<density::f_size,density::feature_list<density::f_none>>,density::f_alignment,density::f_alignment>
  ::runtime_type<density::f_size,density::f_none,density::f_size,density::f_alignment>
            ((runtime_type<density::feature_list<density::f_size,density::feature_list<density::f_none>>,density::f_alignment,density::f_alignment>
              *)&type,(runtime_type<density::f_size,_density::f_none,_density::f_size,_density::f_alignment>
                       *)&c,0);
  buff = (void *)density::
                 runtime_type<density::f_size,density::f_alignment,density::f_ostream,density::f_default_construct,density::f_destroy>
                 ::make<std::complex<float>>();
  sVar2 = density::
          runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
          ::size((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                  *)&buff);
  sVar3 = density::
          runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
          ::alignment((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                       *)&buff);
  i_dest = density::aligned_allocate(sVar2,sVar3,0);
  density::
  runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
  ::default_construct((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                       *)&buff,i_dest);
  this = density::
         runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
         ::get_feature<density::f_ostream>
                   ((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                     *)&buff);
  density::f_ostream::operator()(this,(ostream *)&std::cout,i_dest);
  density::
  runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
  ::destroy((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
             *)&buff,i_dest);
  sVar2 = density::
          runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
          ::size((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                  *)&buff);
  sVar3 = density::
          runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
          ::alignment((runtime_type<density::f_size,_density::f_alignment,_density::f_ostream,_density::f_default_construct,_density::f_destroy>
                       *)&buff);
  density::aligned_deallocate(i_dest,sVar2,sVar3,0);
  memset(&r_1,0,8);
  t1_1.m_feature_table =
       (tuple_type *)density::runtime_type<density::f_size,_density::f_alignment>::make<int>();
  t2.m_feature_table = t1_1.m_feature_table;
  bVar1 = density::runtime_type<density::f_size,_density::f_alignment>::operator==(&t2,&t1_1);
  if (!bVar1) {
    __assert_fail("t1 == t2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0xe2,"void density_tests::runtime_type_examples()");
  }
  t2_1.m_feature_table =
       (tuple_type *)density::runtime_type<density::f_size,_density::f_alignment>::make<int>();
  density::runtime_type<density::f_size,_density::f_alignment>::runtime_type
            ((runtime_type<density::f_size,_density::f_alignment> *)&r1);
  r1.m_feature_table = (tuple_type *)t2_1.m_feature_table;
  bVar1 = density::runtime_type<density::f_size,_density::f_alignment>::operator==
                    (&t2_1,(runtime_type<density::f_size,_density::f_alignment> *)&r1);
  if (!bVar1) {
    __assert_fail("t1 == t2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0xf3,"void density_tests::runtime_type_examples()");
  }
  r2 = density::runtime_type<>::make<int>();
  r_2 = density::runtime_type<>::make<double>();
  density::swap(&r2,&r_2);
  bVar1 = density::runtime_type<>::is<double>(&r2);
  if (!bVar1) {
    __assert_fail("r1.is<double>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0x102,"void density_tests::runtime_type_examples()");
  }
  bVar1 = density::runtime_type<>::is<int>(&r_2);
  if (!bVar1) {
    __assert_fail("r2.is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0x103,"void density_tests::runtime_type_examples()");
  }
  local_78 = density::runtime_type<>::make<int>();
  bVar1 = density::runtime_type<>::is<int>(&local_78);
  if (!bVar1) {
    __assert_fail("r.is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0x10b,"void density_tests::runtime_type_examples()");
  }
  bVar1 = density::runtime_type<>::is<double>(&local_78);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!r.is<double>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/runtime_type_examples.cpp"
                  ,0x10c,"void density_tests::runtime_type_examples()");
  }
  return;
}

Assistant:

void runtime_type_examples()
    {
        using namespace density;
        {
            // clang-format off
            //! [runtime_type example 1]
    using RuntimeType_1 = runtime_type<f_size, f_alignment>;
    using RuntimeType_2 = runtime_type<f_size, f_none, f_size, f_alignment>;
    using RuntimeType_3 = runtime_type<feature_list<f_size, feature_list<f_none>>, f_alignment, f_alignment>;
    RuntimeType_1 a;
    RuntimeType_2 b = a;
    RuntimeType_3 c = b;
            //! [runtime_type example 1]
            // clang-format on
        }
        {
            // clang-format off
            //! [runtime_type example 3]
    // we just want to create, print and destroy objects
    using RuntimeType =
        runtime_type<f_size, f_alignment, f_ostream, f_default_construct, f_destroy>;

    // create a runtime type bound to std::complex<float> (the target type)
    auto const type = RuntimeType::make<std::complex<float>>();

    /* From now on, we can manage instances of the target type just using the runtime_type.
        Note that this is a kind of generic code different from C++ templates, because the 
        type is bound at runtime. 
        It's also very low-level code, and for simplicity it's not exception-safe. */

    // allocate and default construct an object
    void * const buff = aligned_allocate(type.size(), type.alignment());
    type.default_construct(buff); /* equivalent to get_feature<f_default_construct>()(buff). 
        default_construct is just a convenience function. */

    // now print the object std::cout
    type.get_feature<f_ostream>()(std::cout, buff); /* There is no convenience function to 
        do that, use get_feature. */

    /* destroy and deallocate. */
    type.destroy(buff);
    aligned_deallocate(buff, type.size(), type.alignment());
            //! [runtime_type example 3]
            // clang-format on
        }
        {
            // clang-format off
            //! [runtime_type tuple_type example 1]
    using RuntimeRype = runtime_type<f_size, feature_list<f_none, f_alignment> >;
    static_assert( std::is_same<
        RuntimeRype::tuple_type, 
        std::tuple<f_size, f_alignment>
    >::value, "");
            //! [runtime_type tuple_type example 1]
            // clang-format on
        }
#if !defined(__GNUC__) || defined(__clang__) /* gcc has some bugs in constexpr
			evaluation (m_feature_table == nullptr is not a constant expression) */
        {
            // clang-format off
            using T = int;
            using R = runtime_type<>;
            //! [runtime_type construct example 1]
    constexpr R r;
    static_assert(r.empty(), "");
    static_assert(!r.is<T>(), "");
            //! [runtime_type construct example 1]
            // clang-format on
        }
        {
            // clang-format off
            using T = int;
            using R = runtime_type<>;
            //! [runtime_type make example 1]
    constexpr auto r = R::make<T>();
    static_assert(!r.empty(), "");
    static_assert(r != R(), "");
    static_assert(r.is<T>(), "");
            //! [runtime_type make example 1]
            // clang-format on
        }
#endif
        {
            // clang-format off
            //! [runtime_type copy example 1]
    using Rt1 = runtime_type<f_size, f_alignment>;
    using Rt2 = runtime_type<feature_list<f_size>, f_none, f_alignment>;
    Rt1 t1    = Rt1::make<int>();
    Rt1 t2    = t1; // valid because Rt1 and Rt2 are equivalent
    assert(t1 == t2);

    using Rt3 =
        runtime_type<feature_list<f_size, f_default_construct>, f_none, f_alignment>;
    // Rt3 includes f_default_construct, so it's not equivalent to Rt1 and Rt2
    static_assert(!std::is_constructible<Rt1, Rt3>::value, "");
            //! [runtime_type copy example 1]
            // clang-format on
        }
        {
            // clang-format off
            //! [runtime_type assign example 1]
    using Rt1 = runtime_type<f_size, f_alignment>;
    using Rt2 = runtime_type<feature_list<f_size>, f_none, f_alignment>;
    Rt1 t1    = Rt1::make<int>();
    Rt1 t2;
    t2 = t1; // valid because Rt1 and Rt2 are equivalent
    assert(t1 == t2);

    using Rt3 =
        runtime_type<feature_list<f_size, f_default_construct>, f_none, f_alignment>;
    // Rt3 includes f_default_construct, so it's not equivalent to Rt1 and Rt2
    static_assert(!std::is_assignable<Rt1, Rt3>::value, "");
            //! [runtime_type assign example 1]
            // clang-format on
        }
        {
            // clang-format off
            //! [runtime_type swap example 1]
    auto r1 = runtime_type<>::make<int>();
    auto r2 = runtime_type<>::make<double>();
    swap(r1, r2);
    assert(r1.is<double>());
    assert(r2.is<int>());
            //! [runtime_type swap example 1]
            // clang-format on
        }
        {
            // clang-format off
            //! [runtime_type is example 1]
    auto r = runtime_type<>::make<int>();
    assert(r.is<int>());
    assert(!r.is<double>());
            //! [runtime_type is example 1]
            // clang-format on
        }
    }